

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDM.cpp
# Opt level: O3

int SendNbSimpleMessageAndWaitNsMDM(MDM *pMDM,BOOL *pbError,int n,int nb,int msgid,char *msg)

{
  int iVar1;
  ssize_t sVar2;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  uint8 buf [4];
  undefined4 local_68;
  uint local_64;
  int local_60;
  int local_5c;
  timeval local_58;
  BOOL *local_48;
  timespec local_40;
  
  local_68 = 0;
  local_5c = n;
  if (msg[3] == '\0') {
    strcpy((char *)&local_68,msg);
  }
  else {
    local_68 = *(undefined4 *)msg;
  }
  if (nb < 1) {
    iVar7 = 0;
  }
  else {
    iVar7 = 0;
    local_64 = msgid;
    local_60 = nb;
    local_48 = pbError;
    while (3 < pMDM->InternalBufferSize) {
      iVar1 = (pMDM->RS232Port).DevType;
      if (iVar1 - 1U < 4) {
        iVar1 = (pMDM->RS232Port).s;
        uVar6 = 0;
        do {
          sVar2 = send(iVar1,(void *)((long)&local_68 + uVar6),(ulong)(4 - (int)uVar6),0);
          if ((int)sVar2 < 1) goto LAB_001c55ed;
          uVar5 = (int)uVar6 + (int)sVar2;
          uVar6 = (ulong)uVar5;
        } while ((int)uVar5 < 4);
      }
      else {
        if (iVar1 != 0) {
LAB_001c55ed:
          pcVar4 = "Error sending data with a MDM. ";
          goto LAB_001c55f4;
        }
        iVar1 = *(int *)&(pMDM->RS232Port).hDev;
        uVar6 = 0;
        do {
          sVar2 = write(iVar1,(void *)((long)&local_68 + uVar6),(ulong)(4 - (int)uVar6));
          if ((int)sVar2 < 1) goto LAB_001c55ed;
          uVar5 = (int)uVar6 + (int)sVar2;
          uVar6 = (ulong)uVar5;
        } while (uVar5 < 4);
      }
      iVar1 = gettimeofday(&local_58,(__timezone_ptr_t)0x0);
      if (iVar1 != 0) {
        local_58.tv_sec = 0;
        local_58.tv_usec = 0;
      }
      if (pMDM->bSaveRawData != 0) {
        fprintf((FILE *)pMDM->pfSaveFile,"%d;%d;%d;%c;%.4s;\n",local_58.tv_sec & 0xffffffff,
                local_58.tv_usec & 0xffffffff,(ulong)local_64,0x73,&local_68);
        fflush((FILE *)pMDM->pfSaveFile);
      }
      if (bExit != 0) {
        return 1;
      }
      iVar1 = local_5c;
      if (AcousticCommandMDM == 0) {
        return 1;
      }
      for (; iVar1 != 0; iVar1 = iVar1 + -1) {
        local_40.tv_sec = 1;
        local_40.tv_nsec = 0;
        nanosleep(&local_40,(timespec *)0x0);
        if (bExit != 0) {
          return 1;
        }
        if (AcousticCommandMDM == 0) {
          return 1;
        }
        bExit = 0;
      }
      iVar7 = iVar7 + 1;
      if (iVar7 == local_60) {
        return 0;
      }
    }
    pcVar4 = "Too many data to send at once. ";
LAB_001c55f4:
    pcVar3 = strtime_m();
    printf("SendAllDataMDM error (%s) : %s(pMDM=%#x)\n",pcVar3,pcVar4,(ulong)pMDM & 0xffffffff);
    *local_48 = 1;
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

inline int SendNbSimpleMessageAndWaitNsMDM(MDM* pMDM, BOOL* pbError, int n, int nb, int msgid, char* msg)
{
	uint8 buf[4];
	int i = 0;
	struct timeval tv;

	memset(buf, 0, sizeof(buf));
	if (msg[3] == 0) strcpy((char*)buf, msg); else memcpy(buf, msg, sizeof(buf));
	for (i = 0; i < nb; i++)
	{
		if (SendAllDataMDM(pMDM, buf, sizeof(buf)) != EXIT_SUCCESS)
		{
			*pbError = TRUE;
			return EXIT_FAILURE;
		}
		if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }
		if (pMDM->bSaveRawData)
		{
			fprintf(pMDM->pfSaveFile, "%d;%d;%d;%c;%.4s;\n", (int)tv.tv_sec, (int)tv.tv_usec, msgid, 's', buf);
			fflush(pMDM->pfSaveFile);
		}
		if (WaitNsMDM(n) != EXIT_SUCCESS) return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}